

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O2

void WavParserHelper::PrintRIFFChunk(RIFFChunk rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string WAVE;
  string local_50;
  string RIFF;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&RIFF,rhs.ckID,(allocator<char> *)&WAVE);
  std::__cxx11::string::resize((ulong)&RIFF);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&WAVE,rhs.WavID,(allocator<char> *)&local_90);
  std::__cxx11::string::resize((ulong)&WAVE);
  std::operator+(&local_90,"ChunkID: ",&RIFF);
  PrintLog(&local_90,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::to_string(&local_50,rhs.ckSize);
  std::operator+(&local_90,"ChunkSize: ",&local_50);
  PrintLog(&local_90,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_90,"WAVE: ",&WAVE);
  PrintLog(&local_90,(ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&local_90);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&WAVE);
  std::__cxx11::string::~string((string *)&RIFF);
  return;
}

Assistant:

void WavParserHelper::PrintRIFFChunk(RIFFChunk rhs)
{
	//if not restrict size, there problem on \0 with char convert to string
	std::string RIFF(rhs.ckID);
	RIFF.resize(4);
	std::string WAVE(rhs.WavID);
	WAVE.resize(4);

	PrintLog("ChunkID: " + RIFF);
	PrintLog("ChunkSize: " + std::to_string(rhs.ckSize));
	PrintLog("WAVE: " + WAVE);

	std::cout << std::endl;
}